

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::SingularVarBigint<unsigned_int,unsigned_short,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ushort *ptr_00;
  uint *puVar5;
  ulong uVar6;
  Spill spill;
  
  cVar1 = *ptr;
  if (-1 < (long)cVar1) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x31c);
  }
  uVar6 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar6 < 0) {
    uVar3 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar3 < 0) {
      uVar6 = uVar6 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar6 < 0) {
        uVar3 = uVar3 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar3 < 0) {
          uVar6 = uVar6 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar6 < 0) {
            uVar3 = uVar3 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar3 < 0) {
              uVar6 = uVar6 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar6 < 0) {
                uVar3 = uVar3 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar3 < 0) {
                  ptr_00 = (ushort *)(ptr + 10);
                  if ((ptr[9] != '\x01') && (ptr[9] < '\0')) {
                    pcVar4 = Error(msg,(char *)ptr_00,ctx,(TcFieldData)(long)cVar1,table,hasbits);
                    return pcVar4;
                  }
                }
                else {
                  ptr_00 = (ushort *)(ptr + 9);
                }
              }
              else {
                ptr_00 = (ushort *)(ptr + 8);
              }
            }
            else {
              ptr_00 = (ushort *)(ptr + 7);
            }
          }
          else {
            ptr_00 = (ushort *)(ptr + 6);
          }
        }
        else {
          ptr_00 = (ushort *)(ptr + 5);
        }
      }
      else {
        ptr_00 = (ushort *)(ptr + 4);
      }
    }
    else {
      ptr_00 = (ushort *)(ptr + 3);
    }
    uVar6 = uVar6 & uVar3;
  }
  else {
    ptr_00 = (ushort *)(ptr + 2);
  }
  puVar5 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar5 & 3) == 0) {
    *puVar5 = (uint)uVar6 & (int)cVar1;
    if (ptr_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar2 = (uint)table->fast_idx_mask & (uint)*ptr_00;
      if ((uVar2 & 7) == 0) {
        pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar2 & 0xfffffff8)))();
        return pcVar4;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar5 & 3) != 0) goto LAB_002a080a;
      *puVar5 = *puVar5 | (uint)hasbits;
    }
    return (char *)ptr_00;
  }
LAB_002a080a:
  AlignFail(puVar5);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  // For some reason clang wants to save 5 registers to the stack here,
  // but we only need four for this code, so save the data we don't need
  // to the stack.  Happily, saving them this way uses regular store
  // instructions rather than PUSH/POP, which saves time at the cost of greater
  // code size, but for this heavily-used piece of code, that's fine.
  struct Spill {
    uint64_t field_data;
    ::google::protobuf::MessageLite* msg;
    const ::google::protobuf::internal::TcParseTableBase* table;
    uint64_t hasbits;
  };
  Spill spill = {data.data, msg, table, hasbits};
#if defined(__GNUC__)
  // This empty asm block convinces the compiler that the contents of spill may
  // have changed, and thus can't be cached in registers.  It's similar to, but
  // more optimal than, the effect of declaring it "volatile".
  asm("" : "+m"(spill));
#endif

  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  data.data = spill.field_data;
  msg = spill.msg;
  table = spill.table;
  hasbits = spill.hasbits;

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}